

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_asl_16_ix(void)

{
  uint address;
  uint uVar1;
  uint value;
  bool local_15;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  uVar1 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  value = (uVar1 & 0x7fff) << 1;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = uVar1 >> 7;
  m68ki_cpu.x_flag = uVar1 >> 7;
  local_15 = (uVar1 & 0xc000) == 0 || (uVar1 & 0xc000) == 0xc000;
  m68ki_cpu.v_flag = (uint)((local_15 ^ 0xffU) & 1) << 7;
  return;
}

Assistant:

static void m68k_op_asl_16_ix(void)
{
	uint ea = EA_AY_IX_16();
	uint src = m68ki_read_16(ea);
	uint res = MASK_OUT_ABOVE_16(src << 1);

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_X = FLAG_C = src >> 7;
	src &= 0xc000;
	FLAG_V = (!(src == 0 || src == 0xc000))<<7;
}